

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(TypeManager *this,Instruction *inst)

{
  byte bVar1;
  initializer_list<unsigned_int> __l;
  uint uVar2;
  bool bVar3;
  Op OVar4;
  Dim dimen;
  ImageFormat f;
  AccessQualifier qualifier;
  StorageClass SVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  mapped_type *ppIVar10;
  const_iterator __first;
  const_iterator __last;
  reference pvVar11;
  size_type sVar12;
  size_type sVar13;
  Operand *pOVar14;
  Type *pTVar15;
  TypeManager *pTVar16;
  IRContext *pIVar17;
  DecorationManager *pDVar18;
  reference ppIVar19;
  pointer puVar20;
  pointer pTVar21;
  mapped_type *ppTVar22;
  mapped_type *pmVar23;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar24;
  AccessQualifier local_2dc;
  pointer local_280;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_278;
  undefined1 local_270;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_268;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pair;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  unique;
  Instruction *dec;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  spv_position_t local_200;
  uint32_t local_1e4;
  uint32_t local_1e0;
  uint32_t id;
  undefined1 local_1d8 [4];
  uint32_t i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> perm;
  uint32_t count;
  uint32_t target_id;
  Type *local_1b0;
  uint32_t local_1a8;
  uint local_1a4;
  uint32_t param_type_id;
  uint32_t i_1;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  Type *return_type;
  uint32_t return_type_id;
  uint32_t uStack_174;
  bool incomplete_type_1;
  uint32_t local_170;
  uint32_t local_16c;
  undefined1 local_168 [4];
  uint32_t pointee_type_id;
  uint32_t local_148;
  uint32_t local_144;
  Type *local_140;
  uint32_t local_134;
  uint local_130;
  uint32_t type_id;
  uint32_t i;
  bool incomplete_type;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  element_types;
  uint32_t local_108;
  uint32_t local_104;
  uint32_t local_100;
  uint32_t local_fc;
  uint local_f8;
  uint32_t local_f4;
  uint32_t local_f0;
  uint32_t local_ec;
  undefined1 local_e8 [8];
  LengthInfo length_info;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  const_iterator local_b8;
  Op local_ac;
  undefined1 auStack_a8 [4];
  Op opcode;
  bool *local_a0;
  function<void_(const_spvtools::opt::Instruction_&)> local_98;
  bool local_75;
  uint32_t local_74;
  bool has_spec_id;
  uint32_t spec_id;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  Instruction *length_constant_inst;
  uint32_t length_id;
  AccessQualifier access;
  Type *type;
  Instruction *inst_local;
  TypeManager *this_local;
  
  type = (Type *)inst;
  inst_local = (Instruction *)this;
  OVar4 = opt::Instruction::opcode(inst);
  bVar3 = IsTypeInst(OVar4);
  if (!bVar3) {
    return (Type *)(TypeManager *)0x0;
  }
  _length_id = (TypeManager *)0x0;
  OVar4 = opt::Instruction::opcode((Instruction *)type);
  if (OVar4 == OpTypeVoid) {
    pTVar16 = (TypeManager *)::operator_new(0x28);
    Void::Void((Void *)pTVar16);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeBool) {
    pTVar16 = (TypeManager *)::operator_new(0x28);
    Bool::Bool((Bool *)pTVar16);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeInt) {
    pTVar16 = (TypeManager *)::operator_new(0x30);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
    Integer::Integer((Integer *)pTVar16,uVar8,uVar9 != 0);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeFloat) {
    pTVar16 = (TypeManager *)::operator_new(0x28);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    Float::Float((Float *)pTVar16,uVar8);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeVector) {
    pTVar16 = (TypeManager *)::operator_new(0x38);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    pTVar15 = GetType(this,uVar8);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
    Vector::Vector((Vector *)pTVar16,pTVar15,uVar8);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeMatrix) {
    pTVar16 = (TypeManager *)::operator_new(0x38);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    pTVar15 = GetType(this,uVar8);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
    Matrix::Matrix((Matrix *)pTVar16,pTVar15,uVar8);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeImage) {
    uVar8 = opt::Instruction::NumInOperands((Instruction *)type);
    if (uVar8 < 8) {
      local_2dc = AccessQualifierReadOnly;
    }
    else {
      local_2dc = opt::Instruction::GetSingleWordInOperand((Instruction *)type,7);
    }
    length_constant_inst._4_4_ = local_2dc;
    pTVar16 = (TypeManager *)::operator_new(0x48);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    pTVar15 = GetType(this,uVar8);
    dimen = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,2);
    uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,3);
    uVar6 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,4);
    uVar7 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,5);
    f = opt::Instruction::GetSingleWordInOperand((Instruction *)type,6);
    Image::Image((Image *)pTVar16,pTVar15,dimen,uVar8,uVar9 == 1,uVar6 == 1,uVar7,f,
                 length_constant_inst._4_4_);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeSampler) {
    pTVar16 = (TypeManager *)::operator_new(0x28);
    Sampler::Sampler((Sampler *)pTVar16);
    _length_id = pTVar16;
  }
  else if (OVar4 == OpTypeSampledImage) {
    pTVar16 = (TypeManager *)::operator_new(0x30);
    uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
    pTVar15 = GetType(this,uVar8);
    SampledImage::SampledImage((SampledImage *)pTVar16,pTVar15);
    _length_id = pTVar16;
  }
  else {
    if (OVar4 == OpTypeArray) {
      length_constant_inst._0_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
      ppIVar10 = std::
                 unordered_map<unsigned_int,_const_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>_>
                 ::operator[](&this->id_to_constant_inst_,(key_type *)&length_constant_inst);
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar10;
      if ((mapped_type)
          extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (mapped_type)0x0) {
        __assert_fail("length_constant_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x33a,
                      "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                     );
      }
      spec_id = 2;
      local_68 = &spec_id;
      local_60 = 1;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)&has_spec_id);
      __l._M_len = local_60;
      __l._M_array = local_68;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l,
                 (allocator_type *)&has_spec_id);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)&has_spec_id);
      local_74 = 0;
      local_75 = false;
      OVar4 = opt::Instruction::opcode
                        ((Instruction *)
                         extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (OVar4 == OpSpecConstant) {
        pIVar17 = context(this);
        pDVar18 = IRContext::get_decoration_mgr(pIVar17);
        uVar8 = (uint32_t)length_constant_inst;
        _auStack_a8 = &local_74;
        local_a0 = &local_75;
        std::function<void(spvtools::opt::Instruction_const&)>::
        function<spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(spvtools::opt::Instruction_const&)::__0,void>
                  ((function<void(spvtools::opt::Instruction_const&)> *)&local_98,
                   (anon_class_16_2_aac2caa4 *)auStack_a8);
        DecorationManager::ForEachDecoration(pDVar18,uVar8,1,&local_98);
        std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_98);
      }
      local_ac = opt::Instruction::opcode
                           ((Instruction *)
                            extra_words.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      if ((local_75 & 1U) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,&local_74);
      }
      if ((local_ac == OpConstant) || (local_ac == OpSpecConstant)) {
        local_c0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_b8,&local_c0);
        pOVar14 = opt::Instruction::GetOperand
                            ((Instruction *)
                             extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,2);
        __first = utils::SmallVector<unsigned_int,_2UL>::begin(&pOVar14->words);
        pOVar14 = opt::Instruction::GetOperand
                            ((Instruction *)
                             extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,2);
        __last = utils::SmallVector<unsigned_int,_2UL>::end(&pOVar14->words);
        length_info.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      insert<unsigned_int_const*,void>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_58,
                                 local_b8,__first,__last);
        bVar1 = local_75 & 1;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
        *pvVar11 = (uint)(bVar1 != 0);
      }
      else {
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
        if (*pvVar11 != 2) {
          __assert_fail("extra_words[0] == Array::LengthInfo::kDefiningId",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0x35c,
                        "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                       );
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                   (value_type_conflict *)&length_constant_inst);
      }
      sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      if (sVar12 < 2) {
        __assert_fail("extra_words.size() >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x35f,
                      "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                     );
      }
      local_e8._0_4_ = (uint32_t)length_constant_inst;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&length_info,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      pTVar16 = (TypeManager *)::operator_new(0x50);
      uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
      pTVar15 = GetType(this,uVar8);
      Array::Array((Array *)pTVar16,pTVar15,(LengthInfo *)local_e8);
      _length_id = pTVar16;
      local_ec = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
      sVar13 = std::
               unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
               ::count(&this->id_to_incomplete_type_,&local_ec);
      if (sVar13 != 0) {
        local_f0 = opt::Instruction::result_id((Instruction *)type);
        std::
        vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
        ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                  ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                    *)&this->incomplete_types_,&local_f0,(Type **)&length_id);
        pTVar16 = _length_id;
        local_f4 = opt::Instruction::result_id((Instruction *)type);
        ppTVar22 = std::
                   unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                   ::operator[](&this->id_to_incomplete_type_,&local_f4);
        *ppTVar22 = (mapped_type)pTVar16;
        this_local = _length_id;
      }
      local_f8 = (uint)(sVar13 != 0);
      Array::LengthInfo::~LengthInfo((LengthInfo *)local_e8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    }
    else {
      if (OVar4 == OpTypeRuntimeArray) {
        pTVar16 = (TypeManager *)::operator_new(0x30);
        uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
        pTVar15 = GetType(this,uVar8);
        RuntimeArray::RuntimeArray((RuntimeArray *)pTVar16,pTVar15);
        _length_id = pTVar16;
        local_fc = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
        sVar13 = std::
                 unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                 ::count(&this->id_to_incomplete_type_,&local_fc);
        if (sVar13 != 0) {
          local_100 = opt::Instruction::result_id((Instruction *)type);
          std::
          vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
          ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                    ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                      *)&this->incomplete_types_,&local_100,(Type **)&length_id);
          pTVar16 = _length_id;
          local_104 = opt::Instruction::result_id((Instruction *)type);
          ppTVar22 = std::
                     unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                     ::operator[](&this->id_to_incomplete_type_,&local_104);
          *ppTVar22 = (mapped_type)pTVar16;
          return (Type *)_length_id;
        }
        goto LAB_008591d2;
      }
      if (OVar4 == OpTypeStruct) {
        std::
        vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  *)&i);
        type_id._3_1_ = 0;
        for (local_130 = 0; uVar2 = local_130,
            uVar8 = opt::Instruction::NumInOperands((Instruction *)type), uVar2 < uVar8;
            local_130 = local_130 + 1) {
          local_134 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,local_130);
          local_140 = GetType(this,local_134);
          std::
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ::push_back((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                       *)&i,&local_140);
          sVar13 = std::
                   unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                   ::count(&this->id_to_incomplete_type_,&local_134);
          if (sVar13 != 0) {
            type_id._3_1_ = 1;
          }
        }
        pTVar16 = (TypeManager *)::operator_new(0x70);
        Struct::Struct((Struct *)pTVar16,
                       (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        *)&i);
        bVar3 = (type_id._3_1_ & 1) != 0;
        _length_id = pTVar16;
        if (bVar3) {
          local_144 = opt::Instruction::result_id((Instruction *)type);
          std::
          vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
          ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                    ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                      *)&this->incomplete_types_,&local_144,(Type **)&length_id);
          pTVar16 = _length_id;
          local_148 = opt::Instruction::result_id((Instruction *)type);
          ppTVar22 = std::
                     unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                     ::operator[](&this->id_to_incomplete_type_,&local_148);
          *ppTVar22 = (mapped_type)pTVar16;
          this_local = _length_id;
        }
        local_f8 = (uint)bVar3;
        std::
        vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)&i);
      }
      else {
        if (OVar4 == OpTypeOpaque) {
          pTVar16 = (TypeManager *)::operator_new(0x48);
          pOVar14 = opt::Instruction::GetInOperand((Instruction *)type,0);
          Operand::AsString_abi_cxx11_((string *)local_168,pOVar14);
          Opaque::Opaque((Opaque *)pTVar16,(string *)local_168);
          _length_id = pTVar16;
          std::__cxx11::string::~string((string *)local_168);
          goto LAB_008591d2;
        }
        if (OVar4 == OpTypePointer) {
          local_16c = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
          pTVar16 = (TypeManager *)::operator_new(0x38);
          pTVar15 = GetType(this,local_16c);
          SVar5 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
          Pointer::Pointer((Pointer *)pTVar16,pTVar15,SVar5);
          _length_id = pTVar16;
          sVar13 = std::
                   unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                   ::count(&this->id_to_incomplete_type_,&local_16c);
          if (sVar13 != 0) {
            local_170 = opt::Instruction::result_id((Instruction *)type);
            std::
            vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
            ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                      ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                        *)&this->incomplete_types_,&local_170,(Type **)&length_id);
            pTVar16 = _length_id;
            uStack_174 = opt::Instruction::result_id((Instruction *)type);
            ppTVar22 = std::
                       unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                       ::operator[](&this->id_to_incomplete_type_,&stack0xfffffffffffffe8c);
            *ppTVar22 = (mapped_type)pTVar16;
            return (Type *)_length_id;
          }
          return_type_id = opt::Instruction::result_id((Instruction *)type);
          std::
          unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
          ::erase(&this->id_to_incomplete_type_,&return_type_id);
          goto LAB_008591d2;
        }
        if (OVar4 != OpTypeFunction) {
          if (OVar4 == OpTypeEvent) {
            pTVar16 = (TypeManager *)::operator_new(0x28);
            Event::Event((Event *)pTVar16);
            _length_id = pTVar16;
          }
          else if (OVar4 == OpTypeDeviceEvent) {
            pTVar16 = (TypeManager *)::operator_new(0x28);
            DeviceEvent::DeviceEvent((DeviceEvent *)pTVar16);
            _length_id = pTVar16;
          }
          else if (OVar4 == OpTypeReserveId) {
            pTVar16 = (TypeManager *)::operator_new(0x28);
            ReserveId::ReserveId((ReserveId *)pTVar16);
            _length_id = pTVar16;
          }
          else if (OVar4 == OpTypeQueue) {
            pTVar16 = (TypeManager *)::operator_new(0x28);
            analysis::Queue::Queue((Queue *)pTVar16);
            _length_id = pTVar16;
          }
          else if (OVar4 == OpTypePipe) {
            pTVar16 = (TypeManager *)::operator_new(0x28);
            qualifier = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
            Pipe::Pipe((Pipe *)pTVar16,qualifier);
            _length_id = pTVar16;
          }
          else {
            if (OVar4 == OpTypeForwardPointer) {
              perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              pTVar16 = (TypeManager *)::operator_new(0x38);
              uVar8 = perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
              SVar5 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              ForwardPointer::ForwardPointer((ForwardPointer *)pTVar16,uVar8,SVar5);
              _length_id = pTVar16;
              std::
              vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
              ::emplace_back<unsigned_int&,spvtools::opt::analysis::Type*&>
                        ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                          *)&this->incomplete_types_,
                         (uint *)((long)&perm.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         (Type **)&length_id);
              pTVar16 = _length_id;
              ppTVar22 = std::
                         unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                         ::operator[](&this->id_to_incomplete_type_,
                                      (key_type *)
                                      ((long)&perm.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ));
              *ppTVar22 = (mapped_type)pTVar16;
              return (Type *)_length_id;
            }
            if (OVar4 == OpTypePipeStorage) {
              pTVar16 = (TypeManager *)::operator_new(0x28);
              PipeStorage::PipeStorage((PipeStorage *)pTVar16);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeNamedBarrier) {
              pTVar16 = (TypeManager *)::operator_new(0x28);
              NamedBarrier::NamedBarrier((NamedBarrier *)pTVar16);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeCooperativeMatrixKHR) {
              pTVar16 = (TypeManager *)::operator_new(0x40);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              pTVar15 = GetType(this,uVar8);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,2);
              uVar6 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,3);
              uVar7 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,4);
              CooperativeMatrixKHR::CooperativeMatrixKHR
                        ((CooperativeMatrixKHR *)pTVar16,pTVar15,uVar8,uVar9,uVar6,uVar7);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeRayQueryKHR) {
              pTVar16 = (TypeManager *)::operator_new(0x28);
              RayQueryKHR::RayQueryKHR((RayQueryKHR *)pTVar16);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeNodePayloadArrayAMDX) {
              pTVar16 = (TypeManager *)::operator_new(0x30);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              pTVar15 = GetType(this,uVar8);
              NodePayloadArrayAMDX::NodePayloadArrayAMDX((NodePayloadArrayAMDX *)pTVar16,pTVar15);
              _length_id = pTVar16;
              local_108 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              sVar13 = std::
                       unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                       ::count(&this->id_to_incomplete_type_,&local_108);
              if (sVar13 != 0) {
                element_types.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     opt::Instruction::result_id((Instruction *)type);
                std::
                vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                          ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                            *)&this->incomplete_types_,
                           (uint *)((long)&element_types.
                                           super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                           (Type **)&length_id);
                pTVar16 = _length_id;
                element_types.
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                     opt::Instruction::result_id((Instruction *)type);
                ppTVar22 = std::
                           unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                           ::operator[](&this->id_to_incomplete_type_,
                                        (key_type *)
                                        &element_types.
                                         super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                *ppTVar22 = (mapped_type)pTVar16;
                return (Type *)_length_id;
              }
            }
            else if (OVar4 == OpTypeHitObjectNV) {
              pTVar16 = (TypeManager *)::operator_new(0x28);
              HitObjectNV::HitObjectNV((HitObjectNV *)pTVar16);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeCooperativeVectorNV) {
              pTVar16 = (TypeManager *)::operator_new(0x38);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              pTVar15 = GetType(this,uVar8);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              CooperativeVectorNV::CooperativeVectorNV((CooperativeVectorNV *)pTVar16,pTVar15,uVar8)
              ;
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeAccelerationStructureKHR) {
              pTVar16 = (TypeManager *)::operator_new(0x28);
              AccelerationStructureNV::AccelerationStructureNV((AccelerationStructureNV *)pTVar16);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeCooperativeMatrixNV) {
              pTVar16 = (TypeManager *)::operator_new(0x40);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              pTVar15 = GetType(this,uVar8);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,2);
              uVar6 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,3);
              CooperativeMatrixNV::CooperativeMatrixNV
                        ((CooperativeMatrixNV *)pTVar16,pTVar15,uVar8,uVar9,uVar6);
              _length_id = pTVar16;
            }
            else if (OVar4 == OpTypeTensorLayoutNV) {
              pTVar16 = (TypeManager *)::operator_new(0x30);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              TensorLayoutNV::TensorLayoutNV((TensorLayoutNV *)pTVar16,uVar8,uVar9);
              _length_id = pTVar16;
            }
            else {
              if (OVar4 != OpTypeTensorViewNV) {
                __assert_fail("false && \"Type not handled by the type manager.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                              ,0x3fc,
                              "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                             );
              }
              perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   opt::Instruction::NumOperands((Instruction *)type);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
              for (id = 2; id < (uint)perm.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  id = id + 1) {
                local_1e0 = opt::Instruction::GetSingleWordOperand((Instruction *)type,id);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,
                           &local_1e0);
              }
              pTVar16 = (TypeManager *)::operator_new(0x48);
              uVar8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
              uVar9 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,1);
              TensorViewNV::TensorViewNV
                        ((TensorViewNV *)pTVar16,uVar8,uVar9,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
              local_f8 = 2;
              _length_id = pTVar16;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
            }
          }
          goto LAB_008591d2;
        }
        return_type._7_1_ = 0;
        return_type._0_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)type,0);
        sVar13 = std::
                 unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                 ::count(&this->id_to_incomplete_type_,(key_type *)&return_type);
        if (sVar13 != 0) {
          return_type._7_1_ = 1;
        }
        param_types.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)GetType(this,(uint32_t)return_type);
        std::
        vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  *)&param_type_id);
        for (local_1a4 = 1; uVar2 = local_1a4,
            uVar8 = opt::Instruction::NumInOperands((Instruction *)type), uVar2 < uVar8;
            local_1a4 = local_1a4 + 1) {
          local_1a8 = opt::Instruction::GetSingleWordInOperand((Instruction *)type,local_1a4);
          local_1b0 = GetType(this,local_1a8);
          std::
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ::push_back((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                       *)&param_type_id,&local_1b0);
          sVar13 = std::
                   unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                   ::count(&this->id_to_incomplete_type_,&local_1a8);
          if (sVar13 != 0) {
            return_type._7_1_ = 1;
          }
        }
        pTVar16 = (TypeManager *)::operator_new(0x48);
        analysis::Function::Function
                  ((Function *)pTVar16,
                   (Type *)param_types.
                           super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    *)&param_type_id);
        bVar3 = (return_type._7_1_ & 1) != 0;
        _length_id = pTVar16;
        if (bVar3) {
          target_id = opt::Instruction::result_id((Instruction *)type);
          std::
          vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
          ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                    ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                      *)&this->incomplete_types_,&target_id,(Type **)&length_id);
          pTVar16 = _length_id;
          count = opt::Instruction::result_id((Instruction *)type);
          ppTVar22 = std::
                     unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                     ::operator[](&this->id_to_incomplete_type_,&count);
          *ppTVar22 = (mapped_type)pTVar16;
          this_local = _length_id;
        }
        local_f8 = (uint)bVar3;
        std::
        vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)&param_type_id);
      }
    }
    if (local_f8 != 0) {
      return (Type *)this_local;
    }
  }
LAB_008591d2:
  local_1e4 = opt::Instruction::result_id((Instruction *)type);
  if (local_1e4 == 0) {
    local_200.line = 0x401;
    local_200.column = 0;
    local_200.index = 0;
    Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
        ,&local_200,"assertion failed: instruction without result id found");
    exit(1);
  }
  if (_length_id != (TypeManager *)0x0) {
    pIVar17 = context(this);
    pDVar18 = IRContext::get_decoration_mgr(pIVar17);
    DecorationManager::GetDecorationsFor
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2,pDVar18,local_1e4,true);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
    dec = (Instruction *)
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&dec), bVar3) {
      ppIVar19 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2);
      AttachDecoration(this,*ppIVar19,(Type *)_length_id);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    std::
    unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>::
    unique_ptr<std::default_delete<spvtools::opt::analysis::Type>,void>
              ((unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>
                *)&pair.second,(pointer)_length_id);
    pVar24 = std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::insert(&this->type_pool_,(value_type *)&pair.second);
    local_278._M_cur =
         (__node_type *)
         pVar24.first.
         super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
         ._M_cur;
    local_270 = pVar24.second;
    local_268._M_cur = local_278._M_cur;
    pair.first.
    super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
    ._M_cur._0_1_ = local_270;
    puVar20 = std::__detail::
              _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
              ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                            *)&local_268);
    pTVar21 = std::
              unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
              ::get(puVar20);
    ppTVar22 = std::
               unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
               ::operator[](&this->id_to_type_,&local_1e4);
    uVar8 = local_1e4;
    *ppTVar22 = pTVar21;
    puVar20 = std::__detail::
              _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
              ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                            *)&local_268);
    local_280 = std::
                unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                ::get(puVar20);
    pmVar23 = std::
              unordered_map<const_spvtools::opt::analysis::Type_*,_unsigned_int,_spvtools::opt::analysis::HashTypePointer,_spvtools::opt::analysis::CompareTypePointers,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>_>
              ::operator[](&this->type_to_id_,&local_280);
    *pmVar23 = uVar8;
    this_local = _length_id;
    local_f8 = 1;
    std::
    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                 *)&pair.second);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2);
    return (Type *)this_local;
  }
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x403;
  Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
      ,(spv_position_t *)
       &decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage,
      "assertion failed: type should not be nullptr at this point");
  exit(1);
}

Assistant:

Type* TypeManager::RecordIfTypeDefinition(const Instruction& inst) {
  if (!IsTypeInst(inst.opcode())) return nullptr;

  Type* type = nullptr;
  switch (inst.opcode()) {
    case spv::Op::OpTypeVoid:
      type = new Void();
      break;
    case spv::Op::OpTypeBool:
      type = new Bool();
      break;
    case spv::Op::OpTypeInt:
      type = new Integer(inst.GetSingleWordInOperand(0),
                         inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeFloat:
      type = new Float(inst.GetSingleWordInOperand(0));
      break;
    case spv::Op::OpTypeVector:
      type = new Vector(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeMatrix:
      type = new Matrix(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeImage: {
      const spv::AccessQualifier access =
          inst.NumInOperands() < 8 ? spv::AccessQualifier::ReadOnly
                                   : static_cast<spv::AccessQualifier>(
                                         inst.GetSingleWordInOperand(7));
      type = new Image(
          GetType(inst.GetSingleWordInOperand(0)),
          static_cast<spv::Dim>(inst.GetSingleWordInOperand(1)),
          inst.GetSingleWordInOperand(2), inst.GetSingleWordInOperand(3) == 1,
          inst.GetSingleWordInOperand(4) == 1, inst.GetSingleWordInOperand(5),
          static_cast<spv::ImageFormat>(inst.GetSingleWordInOperand(6)),
          access);
    } break;
    case spv::Op::OpTypeSampler:
      type = new Sampler();
      break;
    case spv::Op::OpTypeSampledImage:
      type = new SampledImage(GetType(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeArray: {
      const uint32_t length_id = inst.GetSingleWordInOperand(1);
      const Instruction* length_constant_inst = id_to_constant_inst_[length_id];
      assert(length_constant_inst);

      // How will we distinguish one length value from another?
      // Determine extra words required to distinguish this array length
      // from another.
      std::vector<uint32_t> extra_words{Array::LengthInfo::kDefiningId};
      // If it is a specialised constant, retrieve its SpecId.
      // Only OpSpecConstant has a SpecId.
      uint32_t spec_id = 0u;
      bool has_spec_id = false;
      if (length_constant_inst->opcode() == spv::Op::OpSpecConstant) {
        context()->get_decoration_mgr()->ForEachDecoration(
            length_id, uint32_t(spv::Decoration::SpecId),
            [&spec_id, &has_spec_id](const Instruction& decoration) {
              assert(decoration.opcode() == spv::Op::OpDecorate);
              spec_id = decoration.GetSingleWordOperand(2u);
              has_spec_id = true;
            });
      }
      const auto opcode = length_constant_inst->opcode();
      if (has_spec_id) {
        extra_words.push_back(spec_id);
      }
      if ((opcode == spv::Op::OpConstant) ||
          (opcode == spv::Op::OpSpecConstant)) {
        // Always include the literal constant words.  In the spec constant
        // case, the constant might not be overridden, so it's still
        // significant.
        extra_words.insert(extra_words.end(),
                           length_constant_inst->GetOperand(2).words.begin(),
                           length_constant_inst->GetOperand(2).words.end());
        extra_words[0] = has_spec_id ? Array::LengthInfo::kConstantWithSpecId
                                     : Array::LengthInfo::kConstant;
      } else {
        assert(extra_words[0] == Array::LengthInfo::kDefiningId);
        extra_words.push_back(length_id);
      }
      assert(extra_words.size() >= 2);
      Array::LengthInfo length_info{length_id, extra_words};

      type = new Array(GetType(inst.GetSingleWordInOperand(0)), length_info);

      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeRuntimeArray:
      type = new RuntimeArray(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeNodePayloadArrayAMDX:
      type = new NodePayloadArrayAMDX(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeStruct: {
      std::vector<const Type*> element_types;
      bool incomplete_type = false;
      for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
        uint32_t type_id = inst.GetSingleWordInOperand(i);
        element_types.push_back(GetType(type_id));
        if (id_to_incomplete_type_.count(type_id)) {
          incomplete_type = true;
        }
      }
      type = new Struct(element_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeOpaque: {
      type = new Opaque(inst.GetInOperand(0).AsString());
    } break;
    case spv::Op::OpTypePointer: {
      uint32_t pointee_type_id = inst.GetSingleWordInOperand(1);
      type = new Pointer(
          GetType(pointee_type_id),
          static_cast<spv::StorageClass>(inst.GetSingleWordInOperand(0)));

      if (id_to_incomplete_type_.count(pointee_type_id)) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      id_to_incomplete_type_.erase(inst.result_id());

    } break;
    case spv::Op::OpTypeFunction: {
      bool incomplete_type = false;
      uint32_t return_type_id = inst.GetSingleWordInOperand(0);
      if (id_to_incomplete_type_.count(return_type_id)) {
        incomplete_type = true;
      }
      Type* return_type = GetType(return_type_id);
      std::vector<const Type*> param_types;
      for (uint32_t i = 1; i < inst.NumInOperands(); ++i) {
        uint32_t param_type_id = inst.GetSingleWordInOperand(i);
        param_types.push_back(GetType(param_type_id));
        if (id_to_incomplete_type_.count(param_type_id)) {
          incomplete_type = true;
        }
      }

      type = new Function(return_type, param_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeEvent:
      type = new Event();
      break;
    case spv::Op::OpTypeDeviceEvent:
      type = new DeviceEvent();
      break;
    case spv::Op::OpTypeReserveId:
      type = new ReserveId();
      break;
    case spv::Op::OpTypeQueue:
      type = new Queue();
      break;
    case spv::Op::OpTypePipe:
      type = new Pipe(
          static_cast<spv::AccessQualifier>(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeForwardPointer: {
      // Handling of forward pointers is different from the other types.
      uint32_t target_id = inst.GetSingleWordInOperand(0);
      type = new ForwardPointer(target_id, static_cast<spv::StorageClass>(
                                               inst.GetSingleWordInOperand(1)));
      incomplete_types_.emplace_back(target_id, type);
      id_to_incomplete_type_[target_id] = type;
      return type;
    }
    case spv::Op::OpTypePipeStorage:
      type = new PipeStorage();
      break;
    case spv::Op::OpTypeNamedBarrier:
      type = new NamedBarrier();
      break;
    case spv::Op::OpTypeAccelerationStructureNV:
      type = new AccelerationStructureNV();
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
      type = new CooperativeMatrixNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1),
                                     inst.GetSingleWordInOperand(2),
                                     inst.GetSingleWordInOperand(3));
      break;
    case spv::Op::OpTypeCooperativeMatrixKHR:
      type = new CooperativeMatrixKHR(
          GetType(inst.GetSingleWordInOperand(0)),
          inst.GetSingleWordInOperand(1), inst.GetSingleWordInOperand(2),
          inst.GetSingleWordInOperand(3), inst.GetSingleWordInOperand(4));
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      type = new CooperativeVectorNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeRayQueryKHR:
      type = new RayQueryKHR();
      break;
    case spv::Op::OpTypeHitObjectNV:
      type = new HitObjectNV();
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      type = new TensorLayoutNV(inst.GetSingleWordInOperand(0),
                                inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeTensorViewNV: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> perm;
      for (uint32_t i = 2; i < count; ++i) {
        perm.push_back(inst.GetSingleWordOperand(i));
      }
      type = new TensorViewNV(inst.GetSingleWordInOperand(0),
                              inst.GetSingleWordInOperand(1), perm);
      break;
    }
    default:
      assert(false && "Type not handled by the type manager.");
      break;
  }

  uint32_t id = inst.result_id();
  SPIRV_ASSERT(consumer_, id != 0, "instruction without result id found");
  SPIRV_ASSERT(consumer_, type != nullptr,
               "type should not be nullptr at this point");
  std::vector<Instruction*> decorations =
      context()->get_decoration_mgr()->GetDecorationsFor(id, true);
  for (auto dec : decorations) {
    AttachDecoration(*dec, type);
  }
  std::unique_ptr<Type> unique(type);
  auto pair = type_pool_.insert(std::move(unique));
  id_to_type_[id] = pair.first->get();
  type_to_id_[pair.first->get()] = id;
  return type;
}